

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

AMQP_VALUE amqpvalue_get_list_item_in_place(AMQP_VALUE value,size_t index)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  char *pcVar3;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar3 = "NULL value";
    iVar2 = 0x1d0e;
  }
  else {
    if ((value->type == AMQP_TYPE_LIST) && (index < (value->value).binary_value.length)) {
      return *(AMQP_VALUE *)(&((value->value).described_value.descriptor)->type + index * 2);
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar3 = "Attempt to get list item in place on a non-list type";
    iVar2 = 0x1d18;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
            ,"amqpvalue_get_list_item_in_place",iVar2,1,pcVar3);
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_get_list_item_in_place(AMQP_VALUE value, size_t index)
{
    AMQP_VALUE result;

    if (value == NULL)
    {
        LogError("NULL value");
        result = NULL;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;

        if ((value_data->type != AMQP_TYPE_LIST) ||
            (value_data->value.list_value.count <= index))
        {
            LogError("Attempt to get list item in place on a non-list type");
            result = NULL;
        }
        else
        {
            result = value_data->value.list_value.items[index];
        }
    }

    return result;
}